

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall pbrt::ParameterDictionary::checkParameterTypes(ParameterDictionary *this)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  long lVar5;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar4 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar4 = paVar1;
  }
  lVar5 = 0;
  do {
    if (sVar2 << 3 == lVar5) {
      return;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             ((long)paVar4 + lVar5);
    bVar3 = std::operator!=(__lhs,"bool");
    if (bVar3) {
      bVar3 = std::operator!=(__lhs,"float");
      if (bVar3) {
        bVar3 = std::operator!=(__lhs,"integer");
        if (bVar3) {
          bVar3 = std::operator!=(__lhs,"point2");
          if (bVar3) {
            bVar3 = std::operator!=(__lhs,"vector2");
            if (bVar3) {
              bVar3 = std::operator!=(__lhs,"point3");
              if (bVar3) {
                bVar3 = std::operator!=(__lhs,"vector3");
                if (bVar3) {
                  bVar3 = std::operator!=(__lhs,"normal");
                  if (bVar3) {
                    bVar3 = std::operator!=(__lhs,"string");
                    if (bVar3) {
                      bVar3 = std::operator!=(__lhs,"texture");
                      if (bVar3) {
                        bVar3 = std::operator!=(__lhs,"rgb");
                        if (bVar3) {
                          bVar3 = std::operator!=(__lhs,"spectrum");
                          if (bVar3) {
                            bVar3 = std::operator!=(__lhs,"blackbody");
                            if (bVar3) {
                              ErrorExit<std::__cxx11::string_const&>
                                        ((FileLoc *)(__lhs + 2),"%s: unknown parameter type",__lhs);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}